

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

Symbol * __thiscall
ByteCodeGenerator::FindSymbol
          (ByteCodeGenerator *this,Symbol **symRef,IdentPtr pid,bool forReference)

{
  undefined1 *puVar1;
  Symbol *this_00;
  IdentPtr pIVar2;
  Scope *symScope;
  FuncInfo *funcInfo;
  code *pcVar3;
  bool bVar4;
  PropertyId PVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  char16 *pcVar7;
  Type *ppFVar8;
  Scope *pSVar9;
  FuncInfo *pFVar10;
  undefined7 in_register_00000009;
  ByteCodeGenerator *this_01;
  undefined8 local_38;
  PropertyId i;
  
  local_38 = in_RAX;
  if (symRef == (Symbol **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x6a0,"(symRef)","symRef");
    if (!bVar4) goto LAB_0077bc7f;
    *puVar6 = 0;
  }
  this_00 = *symRef;
  if (this_00 == (Symbol *)0x0) {
    AssignPropertyId(this,pid);
    return (Symbol *)0x0;
  }
  pIVar2 = this_00->pid;
  symScope = this_00->scope;
  if (symScope == (Scope *)0x0) {
    local_38 = CONCAT44((int)CONCAT71(in_register_00000009,forReference),(PropertyId)local_38);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x6ad,"(symScope)","symScope");
    if (!bVar4) {
LAB_0077bc7f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    forReference = SUB81((ulong)local_38 >> 0x20,0);
  }
  bVar4 = Trace(this);
  if (bVar4) {
    pcVar7 = Symbol::GetSymbolTypeName(this_00);
    Output::Print(L"resolved %s to symbol of type %s: \n",&pIVar2->field_0x22,pcVar7);
  }
  if ((*(ushort *)&this_00->field_0x42 & 0x4008) != 0) {
    return this_00;
  }
  ppFVar8 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  funcInfo = *ppFVar8;
  pFVar10 = symScope->func;
  if (((forReference == false) ||
      (pSVar9 = FindScopeForSym(this,symScope,(Scope *)0x0,(PropertyId *)&local_38,funcInfo),
      pSVar9 == symScope)) || ((pSVar9->field_0x44 & 1) == 0)) {
    if ((pFVar10 == funcInfo) && ((this_00->field_0x42 & 0x10) == 0)) goto LAB_0077bc59;
  }
  else {
    Symbol::SetHasNonLocalReference(this_00);
    Scope::SetIsObject(symScope);
  }
  ProcessCapturedSym(this,this_00);
  this_01 = (ByteCodeGenerator *)funcInfo->byteCodeFunction;
  PVar5 = Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
                    ((ParseableFunctionInfo *)this_01,&this_00->name);
  this_00->position = PVar5;
  ProcessScopeWithCapturedSym(this_01,symScope);
  pFVar10 = symScope->func;
  if (((*(uint *)&pFVar10->field_0xb4 & 8) != 0) && (this_00->symbolType == STFormal)) {
    *(uint *)&pFVar10->field_0xb4 = *(uint *)&pFVar10->field_0xb4 | 0x10;
    puVar1 = &(pFVar10->byteCodeFunction->super_FunctionProxy).field_0x45;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xdfff;
    pFVar10 = symScope->func;
  }
  if (pFVar10 != funcInfo) {
    funcInfo->field_0xb4 = funcInfo->field_0xb4 | 0x80;
  }
LAB_0077bc59:
  if ((this_00->field_0x42 & 0x20) != 0) {
    puVar1 = &symScope->func->field_0xb4;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x200;
  }
  return this_00;
}

Assistant:

Symbol * ByteCodeGenerator::FindSymbol(Symbol **symRef, IdentPtr pid, bool forReference)
{
    const char16 *key = nullptr;

    Symbol *sym = nullptr;
    Assert(symRef);
    if (*symRef)
    {
        sym = *symRef;
    }
    else
    {
        this->AssignPropertyId(pid);
        return nullptr;
    }
    key = reinterpret_cast<const char16*>(sym->GetPid()->Psz());

    Scope *symScope = sym->GetScope();
    Assert(symScope);

#if DBG_DUMP
    if (this->Trace())
    {
        if (sym != nullptr)
        {
            Output::Print(_u("resolved %s to symbol of type %s: \n"), key, sym->GetSymbolTypeName());
        }
        else
        {
            Output::Print(_u("did not resolve %s\n"), key);
        }
    }
#endif

    if (!sym->GetIsGlobal() && !sym->GetIsModuleExportStorage())
    {
        FuncInfo *top = funcInfoStack->Top();

        bool nonLocalRef = symScope->GetFunc() != top;
        Scope *scope = nullptr;
        if (forReference)
        {
            Js::PropertyId i;
            scope = FindScopeForSym(symScope, nullptr, &i, top);
            // If we have a reference to a local within a with, we want to generate a closure represented by an object.
            if (scope != symScope && scope->GetIsDynamic())
            {
                nonLocalRef = true;
                sym->SetHasNonLocalReference();
                symScope->SetIsObject();
            }
        }

        // This may not be a non-local reference, but the symbol may still be accessed non-locally. ('with', e.g.)
        // In that case, make sure we still process the symbol and its scope for closure capture.
        if (nonLocalRef || sym->GetHasNonLocalReference())
        {
            // Symbol referenced through a closure. Mark it as such and give it a property ID.
            this->ProcessCapturedSym(sym);
            sym->SetPosition(top->byteCodeFunction->GetOrAddPropertyIdTracked(sym->GetName()));
            // If this is var is local to a function (meaning that it belongs to the function's scope
            // *or* to scope that need not be instantiated, like a function expression scope, which we'll
            // merge with the function scope, then indicate that fact.
            this->ProcessScopeWithCapturedSym(symScope);
            if (symScope->GetFunc()->GetHasArguments() && sym->GetIsFormal())
            {
                // A formal is referenced non-locally. We need to allocate it on the heap, so
                // do the same for the whole arguments object.

                // Formal is referenced. So count of formals to function > 0.
                // So no need to check for inParams here.

                symScope->GetFunc()->SetHasHeapArguments(true);
            }
            if (symScope->GetFunc() != top)
            {
                top->SetHasClosureReference(true);
            }
        }
        else if (!nonLocalRef && sym->GetHasNonLocalReference() && !sym->GetIsCommittedToSlot() && !sym->HasVisitedCapturingFunc())
        {
            sym->SetHasNonCommittedReference(true);
        }

        if (sym->GetIsFuncExpr())
        {
            symScope->GetFunc()->SetFuncExprNameReference(true);
        }
    }

    return sym;
}